

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COMBICState.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::COMBICState::Encode(COMBICState *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  COMBICState *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui16Length);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui8Index);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_EnvironmentRecord).m_ui8Padding);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui32TSC);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_MunSrc).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui32NumSrcs);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16GeometryIndex);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Padding);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui32SrcType);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32BarrageRate);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32BarrageDuration);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32BarrageCrosswindLength);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32BarrageDownwindLength);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_DetVel).super_DataTypeBase);
  KDataStream::operator<<(pKVar1,this->m_ui32Padding);
  return;
}

Assistant:

void COMBICState::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << m_ui32TSC
           << KDIS_STREAM m_MunSrc
           << m_ui32NumSrcs
           << m_ui16GeometryIndex
           << m_ui16Padding
           << m_ui32SrcType
           << m_f32BarrageRate
           << m_f32BarrageDuration
           << m_f32BarrageCrosswindLength
           << m_f32BarrageDownwindLength
           << KDIS_STREAM m_DetVel
           << m_ui32Padding;
}